

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O1

int linenoiseHistoryAdd(char *line)

{
  int iVar1;
  int iVar2;
  char **__dest;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  
  iVar1 = history_max_len;
  uVar5 = (ulong)(uint)history_max_len;
  if (history == (char **)0x0) {
    history = (char **)malloc(uVar5 * 8);
    if (history == (char **)0x0) {
      return 0;
    }
    memset(history,0,uVar5 * 8);
  }
  iVar2 = history_len;
  if ((((long)history_len == 0) ||
      (iVar3 = strcmp(history[(long)history_len + -1],line), iVar3 != 0)) &&
     (pcVar4 = strdup(line), __dest = history, pcVar4 != (char *)0x0)) {
    if (iVar2 == iVar1) {
      free(*history);
      memmove(__dest,__dest + 1,(ulong)(iVar1 - 1) << 3);
      history_len = iVar2 + -1;
    }
    history[history_len] = pcVar4;
    history_len = history_len + 1;
    return 1;
  }
  return 0;
}

Assistant:

int linenoiseHistoryAdd(const char *line) {
    char *linecopy;

    if (history_max_len == 0) return 0;

    /* Initialization on first call. */
    if (history == NULL) {
        history = malloc(sizeof(char*)*history_max_len);
        if (history == NULL) return 0;
        memset(history,0,(sizeof(char*)*history_max_len));
    }

    /* Don't add duplicated lines. */
    if (history_len && !strcmp(history[history_len-1], line)) return 0;

    /* Add an heap allocated copy of the line in the history.
     * If we reached the max length, remove the older line. */
    linecopy = strdup(line);
    if (!linecopy) return 0;
    if (history_len == history_max_len) {
        free(history[0]);
        memmove(history,history+1,sizeof(char*)*(history_max_len-1));
        history_len--;
    }
    history[history_len] = linecopy;
    history_len++;
    return 1;
}